

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort *puVar1;
  ushort uVar2;
  short sVar3;
  U32 u_1;
  int iVar4;
  ulong uVar5;
  long lVar6;
  FSE_CTable FVar7;
  ulong uVar8;
  uint uVar9;
  FSE_CTable FVar10;
  long lVar11;
  uint uVar12;
  ushort uVar13;
  char *__assertion;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar20;
  
  uVar18 = 1 << ((byte)tableLog & 0x1f);
  uVar20 = (ulong)uVar18;
  uVar16 = 1;
  if (tableLog != 0) {
    uVar16 = (ulong)(uVar18 >> 1);
  }
  if (((ulong)workSpace & 1) == 0) {
    uVar5 = (ulong)(maxSymbolValue + 2);
    if (wkspSize < ((1L << ((byte)tableLog & 0x3f)) + uVar5 & 0xfffffffffffffffe) * 2 + 8) {
      return 0xffffffffffffffd4;
    }
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    if (tableLog < 0x10) {
      uVar14 = uVar18 - 1;
      iVar22 = (uVar18 >> 3) + (uVar18 >> 1) + 3;
      *(undefined2 *)workSpace = 0;
      uVar19 = maxSymbolValue + 1;
      uVar15 = uVar14;
      uVar9 = 0;
      do {
        while( true ) {
          uVar12 = uVar9 + 1;
          if (uVar19 < uVar12) {
            *(short *)((long)workSpace + (ulong)uVar19 * 2) = (short)uVar18 + 1;
            if (uVar15 == uVar14) {
              lVar17 = (long)workSpace + uVar20 + uVar5 * 2;
              lVar11 = 0;
              lVar6 = 0;
              for (uVar15 = 0; uVar15 != uVar19; uVar15 = uVar15 + 1) {
                sVar3 = normalizedCounter[uVar15];
                *(long *)(lVar17 + lVar6) = lVar11;
                for (lVar21 = 8; lVar21 < sVar3; lVar21 = lVar21 + 8) {
                  *(long *)(lVar17 + lVar6 + lVar21) = lVar11;
                }
                if (sVar3 < 0) {
                  __assert_fail("n>=0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                                ,0x84,
                                "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                               );
                }
                lVar6 = lVar6 + sVar3;
                lVar11 = lVar11 + 0x101010101010101;
              }
              if ((uVar18 & 1) != 0) {
                __assert_fail("tableSize % unroll == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                              ,0x8f,
                              "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                             );
              }
              uVar15 = 0;
              for (uVar23 = 0; uVar23 < uVar20; uVar23 = uVar23 + 2) {
                uVar9 = uVar15;
                for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                  *(undefined1 *)((long)workSpace + (ulong)(uVar9 & uVar14) + uVar5 * 2) =
                       *(undefined1 *)(lVar17 + lVar6);
                  uVar9 = uVar9 + iVar22;
                }
                uVar15 = uVar15 + iVar22 * 2 & uVar14;
                lVar17 = lVar17 + 2;
              }
              if (uVar15 != 0) {
                __assert_fail("position == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                              ,0x98,
                              "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                             );
              }
            }
            else {
              uVar9 = 0;
              for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                uVar13 = normalizedCounter[uVar23];
                uVar12 = 0;
                if ((short)uVar13 < 1) {
                  uVar13 = 0;
                }
                for (; uVar12 != uVar13; uVar12 = uVar12 + 1) {
                  *(char *)((long)workSpace + (ulong)uVar9 + uVar5 * 2) = (char)uVar23;
                  do {
                    uVar9 = uVar9 + iVar22 & uVar14;
                  } while (uVar15 < uVar9);
                }
              }
              if (uVar9 != 0) {
                __assert_fail("position==0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                              ,0xa6,
                              "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                             );
              }
            }
            for (uVar23 = 0; uVar20 != uVar23; uVar23 = uVar23 + 1) {
              uVar8 = (ulong)*(byte *)((long)workSpace + uVar23 + uVar5 * 2);
              uVar13 = *(ushort *)((long)workSpace + uVar8 * 2);
              *(ushort *)((long)workSpace + uVar8 * 2) = uVar13 + 1;
              *(short *)((long)ct + (ulong)uVar13 * 2 + 4) = (short)uVar18 + (short)uVar23;
            }
            FVar10 = tableLog * 0x10000 - uVar18;
            iVar22 = 0;
            uVar18 = 0;
            do {
              if (maxSymbolValue < uVar18) {
                return 0;
              }
              uVar20 = (ulong)uVar18;
              sVar3 = normalizedCounter[uVar20];
              if ((sVar3 == -1) || (sVar3 == 1)) {
                ct[uVar16 + uVar20 * 2 + 2] = FVar10;
                if (iVar22 < 0) {
                  __assert_fail("total <= INT_MAX",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                                ,0xbd,
                                "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                               );
                }
                ct[uVar16 + uVar20 * 2 + 1] = iVar22 - 1;
                iVar22 = iVar22 + 1;
              }
              else if (sVar3 == 0) {
                ct[uVar16 + uVar20 * 2 + 2] = FVar10 + 0x10000;
              }
              else {
                if (sVar3 < 2) {
                  __assert_fail("normalizedCounter[s] > 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                                ,0xc2,
                                "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                               );
                }
                uVar15 = ZSTD_highbit32((uint)(ushort)(sVar3 - 1));
                iVar4 = (int)normalizedCounter[uVar20];
                FVar7 = iVar22 - iVar4;
                iVar22 = iVar22 + iVar4;
                ct[uVar16 + uVar20 * 2 + 2] =
                     (tableLog - uVar15) * 0x10000 - (iVar4 << ((byte)(tableLog - uVar15) & 0x1f));
                ct[uVar16 + uVar20 * 2 + 1] = FVar7;
              }
              uVar18 = uVar18 + 1;
            } while( true );
          }
          uVar23 = (ulong)uVar9;
          uVar13 = normalizedCounter[uVar23];
          if (uVar13 != 0xffff) break;
          *(short *)((long)workSpace + (ulong)uVar12 * 2) =
               *(short *)((long)workSpace + uVar23 * 2) + 1;
          uVar23 = (ulong)uVar15;
          uVar15 = uVar15 - 1;
          *(char *)((long)workSpace + uVar23 + uVar5 * 2) = (char)uVar9;
          uVar9 = uVar12;
        }
        if ((short)uVar13 < 0) {
          __assertion = "normalizedCounter[u-1] >= 0";
          uVar18 = 0x6c;
          goto LAB_001f6cb0;
        }
        puVar1 = (ushort *)((long)workSpace + uVar23 * 2);
        uVar2 = *puVar1;
        *(ushort *)((long)workSpace + (ulong)uVar12 * 2) = uVar13 + *puVar1;
        uVar9 = uVar12;
      } while (!CARRY2(uVar13,uVar2));
      __assertion = "cumul[u] >= cumul[u-1]";
      uVar18 = 0x6e;
    }
    else {
      __assertion = "tableLog < 16";
      uVar18 = 0x5b;
    }
  }
  else {
    __assertion = "((size_t)workSpace & 1) == 0";
    uVar18 = 0x56;
  }
LAB_001f6cb0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                ,uVar18,
                "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
               );
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}